

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

void __thiscall
glcts::MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test::initInternals
          (MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x6e8))(1,&this->rbo_id);
  (**(code **)(lVar2 + 0xa0))(0x8d41,this->rbo_id);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Could not set up a renderbuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x798);
  return;
}

Assistant:

void MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test::initInternals()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genRenderbuffers(1, &rbo_id);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a renderbuffer object");
}